

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

int32_t __thiscall
icu_63::RuleBasedCollator::getSortKey
          (RuleBasedCollator *this,UnicodeString *s,uint8_t *dest,int32_t capacity)

{
  ushort uVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  char16_t *pcVar3;
  uint uVar4;
  
  uVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar3 = (s->fUnion).fFields.fArray;
    }
    else {
      pcVar3 = (char16_t *)((long)&s->fUnion + 2);
    }
  }
  else {
    pcVar3 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    uVar4 = (s->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)(short)uVar1 >> 5;
  }
  UNRECOVERED_JUMPTABLE = (this->super_Collator).super_UObject._vptr_UObject[0x22];
  iVar2 = (*UNRECOVERED_JUMPTABLE)
                    (this,pcVar3,(ulong)uVar4,dest,(ulong)(uint)capacity,UNRECOVERED_JUMPTABLE);
  return iVar2;
}

Assistant:

int32_t
RuleBasedCollator::getSortKey(const UnicodeString &s,
                              uint8_t *dest, int32_t capacity) const {
    return getSortKey(s.getBuffer(), s.length(), dest, capacity);
}